

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void ffgerr(int status,char *errtext)

{
  char *errtext_local;
  int status_local;
  
  *errtext = '\0';
  if ((status < 0) || (299 < status)) {
    if (status < 600) {
      switch(status) {
      case 0x12d:
        strcpy(errtext,"illegal HDU number");
        break;
      case 0x12e:
        strcpy(errtext,"column number < 1 or > tfields");
        break;
      default:
        strcpy(errtext,"unknown error status");
        break;
      case 0x130:
        strcpy(errtext,"negative byte address");
        break;
      case 0x132:
        strcpy(errtext,"negative number of elements");
        break;
      case 0x133:
        strcpy(errtext,"bad first row number");
        break;
      case 0x134:
        strcpy(errtext,"bad first element number");
        break;
      case 0x135:
        strcpy(errtext,"not an ASCII (A) column");
        break;
      case 0x136:
        strcpy(errtext,"not a logical (L) column");
        break;
      case 0x137:
        strcpy(errtext,"bad ASCII table datatype");
        break;
      case 0x138:
        strcpy(errtext,"bad binary table datatype");
        break;
      case 0x13a:
        strcpy(errtext,"null value not defined");
        break;
      case 0x13d:
        strcpy(errtext,"not a variable length column");
        break;
      case 0x140:
        strcpy(errtext,"illegal number of dimensions");
        break;
      case 0x141:
        strcpy(errtext,"1st pixel no. > last pixel no.");
        break;
      case 0x142:
        strcpy(errtext,"BSCALE or TSCALn = 0.");
        break;
      case 0x143:
        strcpy(errtext,"illegal axis length < 1");
        break;
      case 0x154:
        strcpy(errtext,"not group table");
        break;
      case 0x155:
        strcpy(errtext,"HDU already member of group");
        break;
      case 0x156:
        strcpy(errtext,"group member not found");
        break;
      case 0x157:
        strcpy(errtext,"group not found");
        break;
      case 0x158:
        strcpy(errtext,"bad group id");
        break;
      case 0x159:
        strcpy(errtext,"too many HDUs tracked");
        break;
      case 0x15a:
        strcpy(errtext,"HDU alread tracked");
        break;
      case 0x15b:
        strcpy(errtext,"bad Grouping option");
        break;
      case 0x15c:
        strcpy(errtext,"identical pointers (groups)");
        break;
      case 0x168:
        strcpy(errtext,"malloc failed in parser");
        break;
      case 0x169:
        strcpy(errtext,"file read error in parser");
        break;
      case 0x16a:
        strcpy(errtext,"null pointer arg (parser)");
        break;
      case 0x16b:
        strcpy(errtext,"empty line (parser)");
        break;
      case 0x16c:
        strcpy(errtext,"cannot unread > 1 line");
        break;
      case 0x16d:
        strcpy(errtext,"parser too deeply nested");
        break;
      case 0x16e:
        strcpy(errtext,"file open failed (parser)");
        break;
      case 0x16f:
        strcpy(errtext,"hit EOF (parser)");
        break;
      case 0x170:
        strcpy(errtext,"bad argument (parser)");
        break;
      case 0x171:
        strcpy(errtext,"unexpected token (parser)");
        break;
      case 0x191:
        strcpy(errtext,"bad int to string conversion");
        break;
      case 0x192:
        strcpy(errtext,"bad float to string conversion");
        break;
      case 0x193:
        strcpy(errtext,"keyword value not integer");
        break;
      case 0x194:
        strcpy(errtext,"keyword value not logical");
        break;
      case 0x195:
        strcpy(errtext,"keyword value not floating pt");
        break;
      case 0x196:
        strcpy(errtext,"keyword value not double");
        break;
      case 0x197:
        strcpy(errtext,"bad string to int conversion");
        break;
      case 0x198:
        strcpy(errtext,"bad string to float conversion");
        break;
      case 0x199:
        strcpy(errtext,"bad string to double convert");
        break;
      case 0x19a:
        strcpy(errtext,"illegal datatype code value");
        break;
      case 0x19b:
        strcpy(errtext,"illegal no. of decimals");
        break;
      case 0x19c:
        strcpy(errtext,"datatype conversion overflow");
        break;
      case 0x19d:
        strcpy(errtext,"error compressing image");
        break;
      case 0x19e:
        strcpy(errtext,"error uncompressing image");
        break;
      case 0x1a4:
        strcpy(errtext,"bad date or time conversion");
        break;
      case 0x1af:
        strcpy(errtext,"syntax error in expression");
        break;
      case 0x1b0:
        strcpy(errtext,"expression result wrong type");
        break;
      case 0x1b1:
        strcpy(errtext,"vector result too large");
        break;
      case 0x1b2:
        strcpy(errtext,"missing output column");
        break;
      case 0x1b3:
        strcpy(errtext,"bad data in parsed column");
        break;
      case 0x1b4:
        strcpy(errtext,"output extension of wrong type");
        break;
      case 0x1f5:
        strcpy(errtext,"WCS angle too large");
        break;
      case 0x1f6:
        strcpy(errtext,"bad WCS coordinate");
        break;
      case 0x1f7:
        strcpy(errtext,"error in WCS calculation");
        break;
      case 0x1f8:
        strcpy(errtext,"bad WCS projection type");
        break;
      case 0x1f9:
        strcpy(errtext,"WCS keywords not found");
      }
    }
    else {
      strcpy(errtext,"unknown error status");
    }
  }
  else {
    switch(status) {
    case 0:
      strcpy(errtext,"OK - no error");
      break;
    case 1:
      strcpy(errtext,"non-CFITSIO program error");
      break;
    default:
      strcpy(errtext,"unknown error status");
      break;
    case 0x65:
      strcpy(errtext,"same input and output files");
      break;
    case 0x67:
      strcpy(errtext,"attempt to open too many files");
      break;
    case 0x68:
      strcpy(errtext,"could not open the named file");
      break;
    case 0x69:
      strcpy(errtext,"couldn\'t create the named file");
      break;
    case 0x6a:
      strcpy(errtext,"error writing to FITS file");
      break;
    case 0x6b:
      strcpy(errtext,"tried to move past end of file");
      break;
    case 0x6c:
      strcpy(errtext,"error reading from FITS file");
      break;
    case 0x6e:
      strcpy(errtext,"could not close the file");
      break;
    case 0x6f:
      strcpy(errtext,"array dimensions too big");
      break;
    case 0x70:
      strcpy(errtext,"cannot write to readonly file");
      break;
    case 0x71:
      strcpy(errtext,"could not allocate memory");
      break;
    case 0x72:
      strcpy(errtext,"invalid fitsfile pointer");
      break;
    case 0x73:
      strcpy(errtext,"NULL input pointer");
      break;
    case 0x74:
      strcpy(errtext,"error seeking file position");
      break;
    case 0x75:
      strcpy(errtext,"bad value for file download timeout setting");
      break;
    case 0x79:
      strcpy(errtext,"invalid URL prefix");
      break;
    case 0x7a:
      strcpy(errtext,"too many I/O drivers");
      break;
    case 0x7b:
      strcpy(errtext,"I/O driver init failed");
      break;
    case 0x7c:
      strcpy(errtext,"no I/O driver for this URLtype");
      break;
    case 0x7d:
      strcpy(errtext,"parse error in input file URL");
      break;
    case 0x7e:
      strcpy(errtext,"parse error in range list");
      break;
    case 0x97:
      strcpy(errtext,"bad argument (shared mem drvr)");
      break;
    case 0x98:
      strcpy(errtext,"null ptr arg (shared mem drvr)");
      break;
    case 0x99:
      strcpy(errtext,"no free shared memory handles");
      break;
    case 0x9a:
      strcpy(errtext,"share mem drvr not initialized");
      break;
    case 0x9b:
      strcpy(errtext,"IPC system error (shared mem)");
      break;
    case 0x9c:
      strcpy(errtext,"no memory (shared mem drvr)");
      break;
    case 0x9d:
      strcpy(errtext,"share mem resource deadlock");
      break;
    case 0x9e:
      strcpy(errtext,"lock file open/create failed");
      break;
    case 0x9f:
      strcpy(errtext,"can\'t resize share mem block");
      break;
    case 0xc9:
      strcpy(errtext,"header already has keywords");
      break;
    case 0xca:
      strcpy(errtext,"keyword not found in header");
      break;
    case 0xcb:
      strcpy(errtext,"keyword number out of bounds");
      break;
    case 0xcc:
      strcpy(errtext,"keyword value is undefined");
      break;
    case 0xcd:
      strcpy(errtext,"string missing closing quote");
      break;
    case 0xce:
      strcpy(errtext,"error in indexed keyword name");
      break;
    case 0xcf:
      strcpy(errtext,"illegal character in keyword");
      break;
    case 0xd0:
      strcpy(errtext,"required keywords out of order");
      break;
    case 0xd1:
      strcpy(errtext,"keyword value not positive int");
      break;
    case 0xd2:
      strcpy(errtext,"END keyword not found");
      break;
    case 0xd3:
      strcpy(errtext,"illegal BITPIX keyword value");
      break;
    case 0xd4:
      strcpy(errtext,"illegal NAXIS keyword value");
      break;
    case 0xd5:
      strcpy(errtext,"illegal NAXISn keyword value");
      break;
    case 0xd6:
      strcpy(errtext,"illegal PCOUNT keyword value");
      break;
    case 0xd7:
      strcpy(errtext,"illegal GCOUNT keyword value");
      break;
    case 0xd8:
      strcpy(errtext,"illegal TFIELDS keyword value");
      break;
    case 0xd9:
      strcpy(errtext,"negative table row size");
      break;
    case 0xda:
      strcpy(errtext,"negative number of rows");
      break;
    case 0xdb:
      strcpy(errtext,"named column not found");
      break;
    case 0xdc:
      strcpy(errtext,"illegal SIMPLE keyword value");
      break;
    case 0xdd:
      strcpy(errtext,"first keyword not SIMPLE");
      break;
    case 0xde:
      strcpy(errtext,"second keyword not BITPIX");
      break;
    case 0xdf:
      strcpy(errtext,"third keyword not NAXIS");
      break;
    case 0xe0:
      strcpy(errtext,"missing NAXISn keywords");
      break;
    case 0xe1:
      strcpy(errtext,"first keyword not XTENSION");
      break;
    case 0xe2:
      strcpy(errtext,"CHDU not an ASCII table");
      break;
    case 0xe3:
      strcpy(errtext,"CHDU not a binary table");
      break;
    case 0xe4:
      strcpy(errtext,"PCOUNT keyword not found");
      break;
    case 0xe5:
      strcpy(errtext,"GCOUNT keyword not found");
      break;
    case 0xe6:
      strcpy(errtext,"TFIELDS keyword not found");
      break;
    case 0xe7:
      strcpy(errtext,"missing TBCOLn keyword");
      break;
    case 0xe8:
      strcpy(errtext,"missing TFORMn keyword");
      break;
    case 0xe9:
      strcpy(errtext,"CHDU not an IMAGE extension");
      break;
    case 0xea:
      strcpy(errtext,"illegal TBCOLn keyword value");
      break;
    case 0xeb:
      strcpy(errtext,"CHDU not a table extension");
      break;
    case 0xec:
      strcpy(errtext,"column exceeds width of table");
      break;
    case 0xed:
      strcpy(errtext,"more than 1 matching col. name");
      break;
    case 0xf1:
      strcpy(errtext,"row width not = field widths");
      break;
    case 0xfb:
      strcpy(errtext,"unknown FITS extension type");
      break;
    case 0xfc:
      strcpy(errtext,"1st key not SIMPLE or XTENSION");
      break;
    case 0xfd:
      strcpy(errtext,"END keyword is not blank");
      break;
    case 0xfe:
      strcpy(errtext,"Header fill area not blank");
      break;
    case 0xff:
      strcpy(errtext,"Data fill area invalid");
      break;
    case 0x105:
      strcpy(errtext,"illegal TFORM format code");
      break;
    case 0x106:
      strcpy(errtext,"unknown TFORM datatype code");
      break;
    case 0x107:
      strcpy(errtext,"illegal TDIMn keyword value");
      break;
    case 0x108:
      strcpy(errtext,"invalid BINTABLE heap pointer");
    }
  }
  return;
}

Assistant:

void ffgerr(int status,     /* I - error status value */
            char *errtext)  /* O - error message (max 30 char long + null) */
/*
  Return a short descriptive error message that corresponds to the input
  error status value.  The message may be up to 30 characters long, plus
  the terminating null character.
*/
{
  errtext[0] = '\0';

  if (status >= 0 && status < 300)
  {
    switch (status) {

    case 0:
       strcpy(errtext, "OK - no error");
       break;
    case 1:
       strcpy(errtext, "non-CFITSIO program error");
       break;
    case 101:
       strcpy(errtext, "same input and output files");
       break;
    case 103:
       strcpy(errtext, "attempt to open too many files");
       break;
    case 104:
       strcpy(errtext, "could not open the named file");
       break;
    case 105:
       strcpy(errtext, "couldn't create the named file");
       break;
    case 106:
       strcpy(errtext, "error writing to FITS file");
       break;
    case 107:
       strcpy(errtext, "tried to move past end of file");
       break;
    case 108:
       strcpy(errtext, "error reading from FITS file");
       break;
    case 110:
       strcpy(errtext, "could not close the file");
       break;
    case 111:
       strcpy(errtext, "array dimensions too big");
       break;
    case 112:
       strcpy(errtext, "cannot write to readonly file");
       break;
    case 113:
       strcpy(errtext, "could not allocate memory");
       break;
    case 114:
       strcpy(errtext, "invalid fitsfile pointer");
       break;
    case 115:
       strcpy(errtext, "NULL input pointer");
       break;
    case 116:
       strcpy(errtext, "error seeking file position");
       break;
    case 117:
       strcpy(errtext, "bad value for file download timeout setting");
       break;
    case 121:
       strcpy(errtext, "invalid URL prefix");
       break;
    case 122:
       strcpy(errtext, "too many I/O drivers");
       break;
    case 123:
       strcpy(errtext, "I/O driver init failed");
       break;
    case 124:
       strcpy(errtext, "no I/O driver for this URLtype");
       break;
    case 125:
       strcpy(errtext, "parse error in input file URL");
       break;
    case 126:
       strcpy(errtext, "parse error in range list");
       break;
    case 151:
       strcpy(errtext, "bad argument (shared mem drvr)");
       break;
    case 152:
       strcpy(errtext, "null ptr arg (shared mem drvr)");
       break;
    case 153:
       strcpy(errtext, "no free shared memory handles");
       break;
    case 154:
       strcpy(errtext, "share mem drvr not initialized");
       break;
    case 155:
       strcpy(errtext, "IPC system error (shared mem)");
       break;
    case 156:
       strcpy(errtext, "no memory (shared mem drvr)");
       break;
    case 157:
       strcpy(errtext, "share mem resource deadlock");
       break;
    case 158:
       strcpy(errtext, "lock file open/create failed");
       break;
    case 159:
       strcpy(errtext, "can't resize share mem block");
       break;
    case 201:
       strcpy(errtext, "header already has keywords");
       break;
    case 202:
       strcpy(errtext, "keyword not found in header");
       break;
    case 203:
       strcpy(errtext, "keyword number out of bounds");
       break;
    case 204:
       strcpy(errtext, "keyword value is undefined");
       break;
    case 205:
       strcpy(errtext, "string missing closing quote");
       break;
    case 206:
       strcpy(errtext, "error in indexed keyword name");
       break;
    case 207:
       strcpy(errtext, "illegal character in keyword");
       break;
    case 208:
       strcpy(errtext, "required keywords out of order");
       break;
    case 209:
       strcpy(errtext, "keyword value not positive int");
       break;
    case 210:
       strcpy(errtext, "END keyword not found");
       break;
    case 211:
       strcpy(errtext, "illegal BITPIX keyword value");
       break;
    case 212:
       strcpy(errtext, "illegal NAXIS keyword value");
       break;
    case 213:
       strcpy(errtext, "illegal NAXISn keyword value");
       break;
    case 214:
       strcpy(errtext, "illegal PCOUNT keyword value");
       break;
    case 215:
       strcpy(errtext, "illegal GCOUNT keyword value");
       break;
    case 216:
       strcpy(errtext, "illegal TFIELDS keyword value");
       break;
    case 217:
       strcpy(errtext, "negative table row size");
       break;
    case 218:
       strcpy(errtext, "negative number of rows");
       break;
    case 219:
       strcpy(errtext, "named column not found");
       break;
    case 220:
       strcpy(errtext, "illegal SIMPLE keyword value");
       break;
    case 221:
       strcpy(errtext, "first keyword not SIMPLE");
       break;
    case 222:
       strcpy(errtext, "second keyword not BITPIX");
       break;
    case 223:
       strcpy(errtext, "third keyword not NAXIS");
       break;
    case 224:
       strcpy(errtext, "missing NAXISn keywords");
       break;
    case 225:
       strcpy(errtext, "first keyword not XTENSION");
       break;
    case 226:
       strcpy(errtext, "CHDU not an ASCII table");
       break;
    case 227:
       strcpy(errtext, "CHDU not a binary table");
       break;
    case 228:
       strcpy(errtext, "PCOUNT keyword not found");
       break;
    case 229:
       strcpy(errtext, "GCOUNT keyword not found");
       break;
    case 230:
       strcpy(errtext, "TFIELDS keyword not found");
       break;
    case 231:
       strcpy(errtext, "missing TBCOLn keyword");
       break;
    case 232:
       strcpy(errtext, "missing TFORMn keyword");
       break;
    case 233:
       strcpy(errtext, "CHDU not an IMAGE extension");
       break;
    case 234:
       strcpy(errtext, "illegal TBCOLn keyword value");
       break;
    case 235:
       strcpy(errtext, "CHDU not a table extension");
       break;
    case 236:
       strcpy(errtext, "column exceeds width of table");
       break;
    case 237:
       strcpy(errtext, "more than 1 matching col. name");
       break;
    case 241:
       strcpy(errtext, "row width not = field widths");
       break;
    case 251:
       strcpy(errtext, "unknown FITS extension type");
       break;
    case 252:
       strcpy(errtext, "1st key not SIMPLE or XTENSION");
       break;
    case 253:
       strcpy(errtext, "END keyword is not blank");
       break;
    case 254:
       strcpy(errtext, "Header fill area not blank");
       break;
    case 255:
       strcpy(errtext, "Data fill area invalid");
       break;
    case 261:
       strcpy(errtext, "illegal TFORM format code");
       break;
    case 262:
       strcpy(errtext, "unknown TFORM datatype code");
       break;
    case 263:
       strcpy(errtext, "illegal TDIMn keyword value");
       break;
    case 264:
       strcpy(errtext, "invalid BINTABLE heap pointer");
       break;
    default:
       strcpy(errtext, "unknown error status");
       break;
    }
  }
  else if (status < 600)
  {
    switch(status) {

    case 301:
       strcpy(errtext, "illegal HDU number");
       break;
    case 302:
       strcpy(errtext, "column number < 1 or > tfields");
       break;
    case 304:
       strcpy(errtext, "negative byte address");
       break;
    case 306:
       strcpy(errtext, "negative number of elements");
       break;
    case 307:
       strcpy(errtext, "bad first row number");
       break;
    case 308:
       strcpy(errtext, "bad first element number");
       break;
    case 309:
       strcpy(errtext, "not an ASCII (A) column");
       break;
    case 310:
       strcpy(errtext, "not a logical (L) column");
       break;
    case 311:
       strcpy(errtext, "bad ASCII table datatype");
       break;
    case 312:
       strcpy(errtext, "bad binary table datatype");
       break;
    case 314:
       strcpy(errtext, "null value not defined");
       break;
    case 317:
       strcpy(errtext, "not a variable length column");
       break;
    case 320:
       strcpy(errtext, "illegal number of dimensions");
       break;
    case 321:
       strcpy(errtext, "1st pixel no. > last pixel no.");
       break;
    case 322:
       strcpy(errtext, "BSCALE or TSCALn = 0.");
       break;
    case 323:
       strcpy(errtext, "illegal axis length < 1");
       break;
    case 340:
       strcpy(errtext, "not group table");
       break;
    case 341:
       strcpy(errtext, "HDU already member of group");
       break;
    case 342:
       strcpy(errtext, "group member not found");
       break;
    case 343:
       strcpy(errtext, "group not found");
       break;
    case 344:
       strcpy(errtext, "bad group id");
       break;
    case 345:
       strcpy(errtext, "too many HDUs tracked");
       break;
    case 346:
       strcpy(errtext, "HDU alread tracked");
       break;
    case 347:
       strcpy(errtext, "bad Grouping option");
       break;
    case 348:
       strcpy(errtext, "identical pointers (groups)");
       break;
    case 360:
       strcpy(errtext, "malloc failed in parser");
       break;
    case 361:
       strcpy(errtext, "file read error in parser");
       break;
    case 362:
       strcpy(errtext, "null pointer arg (parser)");
       break;
    case 363:
       strcpy(errtext, "empty line (parser)");
       break;
    case 364:
       strcpy(errtext, "cannot unread > 1 line");
       break;
    case 365:
       strcpy(errtext, "parser too deeply nested");
       break;
    case 366:
       strcpy(errtext, "file open failed (parser)");
       break;
    case 367:
       strcpy(errtext, "hit EOF (parser)");
       break;
    case 368:
       strcpy(errtext, "bad argument (parser)");
       break;
    case 369:
       strcpy(errtext, "unexpected token (parser)");
       break;
    case 401:
       strcpy(errtext, "bad int to string conversion");
       break;
    case 402:
       strcpy(errtext, "bad float to string conversion");
       break;
    case 403:
       strcpy(errtext, "keyword value not integer");
       break;
    case 404:
       strcpy(errtext, "keyword value not logical");
       break;
    case 405:
       strcpy(errtext, "keyword value not floating pt");
       break;
    case 406:
       strcpy(errtext, "keyword value not double");
       break;
    case 407:
       strcpy(errtext, "bad string to int conversion");
       break;
    case 408:
       strcpy(errtext, "bad string to float conversion");
       break;
    case 409:
       strcpy(errtext, "bad string to double convert");
       break;
    case 410:
       strcpy(errtext, "illegal datatype code value");
       break;
    case 411:
       strcpy(errtext, "illegal no. of decimals");
       break;
    case 412:
       strcpy(errtext, "datatype conversion overflow");
       break;
    case 413:
       strcpy(errtext, "error compressing image");
       break;
    case 414:
       strcpy(errtext, "error uncompressing image");
       break;
    case 420:
       strcpy(errtext, "bad date or time conversion");
       break;
    case 431:
       strcpy(errtext, "syntax error in expression");
       break;
    case 432:
       strcpy(errtext, "expression result wrong type");
       break;
    case 433:
       strcpy(errtext, "vector result too large");
       break;
    case 434:
       strcpy(errtext, "missing output column");
       break;
    case 435:
       strcpy(errtext, "bad data in parsed column");
       break;
    case 436:
       strcpy(errtext, "output extension of wrong type");
       break;
    case 501:
       strcpy(errtext, "WCS angle too large");
       break;
    case 502:
       strcpy(errtext, "bad WCS coordinate");
       break;
    case 503:
       strcpy(errtext, "error in WCS calculation");
       break;
    case 504:
       strcpy(errtext, "bad WCS projection type");
       break;
    case 505:
       strcpy(errtext, "WCS keywords not found");
       break;
    default:
       strcpy(errtext, "unknown error status");
       break;
    }
  }
  else
  {
     strcpy(errtext, "unknown error status");
  }
  return;
}